

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampler.cpp
# Opt level: O0

Vector3D * __thiscall
CGL::CosineWeightedHemisphereSampler3D::get_sample
          (CosineWeightedHemisphereSampler3D *this,double *pdf)

{
  double *in_RDX;
  Vector3D *in_RDI;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double theta;
  double r;
  double Xi2;
  double Xi1;
  
  dVar1 = random_uniform();
  dVar2 = random_uniform();
  dVar3 = sqrt(dVar1);
  dVar4 = sqrt(1.0 - dVar1);
  *in_RDX = dVar4 / 3.141592653589793;
  dVar4 = cos(dVar2 * 6.283185307179586);
  dVar2 = sin(dVar2 * 6.283185307179586);
  dVar1 = sqrt(1.0 - dVar1);
  Vector3D::Vector3D(in_RDI,dVar3 * dVar4,dVar3 * dVar2,dVar1);
  return in_RDI;
}

Assistant:

Vector3D CosineWeightedHemisphereSampler3D::get_sample(double *pdf) const {

  double Xi1 = random_uniform();
  double Xi2 = random_uniform();

  double r = sqrt(Xi1);
  double theta = 2. * PI * Xi2;
  *pdf = sqrt(1-Xi1) / PI;
  return Vector3D(r*cos(theta), r*sin(theta), sqrt(1-Xi1));
}